

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_hmask.c
# Opt level: O2

void aom_blend_a64_hmask_c
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,int w,int h)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)w;
  if (w < 1) {
    uVar2 = uVar3;
  }
  if (h < 1) {
    h = 0;
  }
  iVar6 = 0;
  iVar7 = 0;
  for (iVar4 = 0; iVar4 != h; iVar4 = iVar4 + 1) {
    for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      iVar1 = (int)uVar5;
      dst[(uint)(iVar7 + iVar1)] =
           (uint8_t)((uint)src1[(uint)(iVar6 + iVar1)] * (0x40 - (uint)mask[uVar5]) +
                     (uint)src0[(uint)((int)uVar3 + iVar1)] * (uint)mask[uVar5] + 0x20 >> 6);
    }
    iVar7 = iVar7 + dst_stride;
    iVar6 = iVar6 + src1_stride;
    uVar3 = uVar3 + src0_stride;
  }
  return;
}

Assistant:

void aom_blend_a64_hmask_c(uint8_t *dst, uint32_t dst_stride,
                           const uint8_t *src0, uint32_t src0_stride,
                           const uint8_t *src1, uint32_t src1_stride,
                           const uint8_t *mask, int w, int h) {
  int i, j;

  assert(IMPLIES(src0 == dst, src0_stride == dst_stride));
  assert(IMPLIES(src1 == dst, src1_stride == dst_stride));

  assert(h >= 1);
  assert(w >= 1);
  assert(IS_POWER_OF_TWO(h));
  assert(IS_POWER_OF_TWO(w));

  for (i = 0; i < h; ++i) {
    for (j = 0; j < w; ++j) {
      dst[i * dst_stride + j] = AOM_BLEND_A64(
          mask[j], src0[i * src0_stride + j], src1[i * src1_stride + j]);
    }
  }
}